

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

bool testing::internal::FindPairing(MatchMatrix *matrix,MatchResultListener *listener)

{
  ulong uVar1;
  ostream *poVar2;
  MatchResultListener *pMVar3;
  ostream *poVar4;
  ulong uVar5;
  ostream *os;
  size_t mi;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  pointer ppVar9;
  char *sep;
  ElementMatcherPairs matches;
  size_t max_flow;
  
  FindMaxBipartiteMatching(&matches,matrix);
  uVar5 = (long)matches.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)matches.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar1 = *(ulong *)(matrix + 8);
  max_flow = uVar5;
  if (uVar5 == uVar1) {
    if ((1 < uVar5) && (*(long *)(listener + 8) != 0)) {
      sep = "where:\n";
      lVar8 = 8;
      for (uVar6 = 0;
          uVar6 < (ulong)((long)matches.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)matches.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1)
      {
        pMVar3 = MatchResultListener::operator<<(listener,&sep);
        pMVar3 = MatchResultListener::operator<<(pMVar3,(char (*) [13])" - element #");
        pMVar3 = MatchResultListener::operator<<
                           (pMVar3,(unsigned_long *)
                                   ((long)matches.
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8));
        pMVar3 = MatchResultListener::operator<<(pMVar3,(char (*) [25])" is matched by matcher #");
        MatchResultListener::operator<<
                  (pMVar3,(unsigned_long *)
                          ((long)&(matches.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first + lVar8));
        sep = ",\n";
        lVar8 = lVar8 + 0x10;
      }
    }
  }
  else if (*(long *)(listener + 8) != 0) {
    pMVar3 = MatchResultListener::operator<<
                       (listener,(char (*) [89])
                                 "where no permutation of the elements can satisfy all matchers, and the closest match is "
                       );
    pMVar3 = MatchResultListener::operator<<(pMVar3,&max_flow);
    pMVar3 = MatchResultListener::operator<<(pMVar3,(char (*) [5])0x188359);
    sep = *(char **)(matrix + 8);
    pMVar3 = MatchResultListener::operator<<(pMVar3,(unsigned_long *)&sep);
    MatchResultListener::operator<<(pMVar3,(char (*) [30])" matchers with the pairings:\n");
    poVar2 = *(ostream **)(listener + 8);
    std::operator<<(poVar2,"{");
    pcVar7 = "";
    for (ppVar9 = matches.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar9 != matches.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar9 = ppVar9 + 1) {
      poVar4 = std::operator<<(poVar2,pcVar7);
      poVar4 = std::operator<<(poVar4,"\n  (");
      poVar4 = std::operator<<(poVar4,"element #");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"matcher #");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,")");
      pcVar7 = ",";
    }
    std::operator<<(poVar2,"\n}");
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&matches.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  return uVar5 == uVar1;
}

Assistant:

GTEST_API_ bool FindPairing(const MatchMatrix& matrix,
                            MatchResultListener* listener) {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  bool result = (max_flow == matrix.RhsSize());

  if (!result) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can "
                   "satisfy all matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char *sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}